

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

bool xatlas::internal::Fit::EigenSolver3_QLAlgorithm(float (*mat) [3],float *diag,float *subd)

{
  ulong uVar1;
  float fVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int local_b0;
  int local_40;
  
  pfVar10 = diag + 1;
  lVar8 = 1;
  uVar11 = 0;
  bVar12 = false;
  pfVar6 = subd;
  do {
    local_b0 = 0;
    do {
      lVar4 = 0;
      do {
        if (lVar8 + 1 == lVar4) {
          uVar3 = 2;
          goto LAB_001b3a25;
        }
        fVar14 = ABS(pfVar10[lVar4]) + ABS(pfVar10[lVar4 + -1]);
        pfVar9 = pfVar6 + lVar4;
        lVar4 = lVar4 + 1;
      } while ((ABS(*pfVar9) + fVar14 != fVar14) || (NAN(ABS(*pfVar9) + fVar14) || NAN(fVar14)));
      uVar3 = (int)lVar4 - (int)lVar8;
LAB_001b3a25:
      uVar5 = (ulong)uVar3;
      if (uVar11 == uVar5) goto LAB_001b3d4b;
      fVar15 = (diag[uVar11 + 1] - diag[uVar11]) / (subd[uVar11] + subd[uVar11]);
      fVar14 = fVar15 * fVar15 + 1.0;
      if (fVar14 < 0.0) {
        fVar14 = sqrtf(fVar14);
      }
      else {
        fVar14 = SQRT(fVar14);
      }
      fVar17 = 0.0;
      fVar14 = subd[uVar11] /
               ((float)(~-(uint)(fVar15 < 0.0) & (uint)fVar14 |
                       (uint)-fVar14 & -(uint)(fVar15 < 0.0)) + fVar15) +
               (diag[uVar5] - diag[uVar11]);
      if (uVar11 < uVar5) {
        pfVar9 = *mat + uVar5;
        fVar18 = 1.0;
        uVar7 = uVar5;
        fVar15 = 1.0;
        do {
          fVar16 = subd[uVar7 - 1];
          fVar18 = fVar18 * fVar16;
          if (ABS(fVar14) <= ABS(fVar18)) {
            fVar14 = fVar14 / fVar18;
            fVar13 = fVar14 * fVar14 + 1.0;
            if (fVar13 < 0.0) {
              fVar13 = sqrtf(fVar13);
            }
            else {
              fVar13 = SQRT(fVar13);
            }
            subd[uVar7] = fVar18 * fVar13;
            fVar18 = 1.0 / fVar13;
            fVar13 = fVar14 * fVar18;
          }
          else {
            fVar18 = fVar18 / fVar14;
            fVar13 = fVar18 * fVar18 + 1.0;
            if (fVar13 < 0.0) {
              fVar13 = sqrtf(fVar13);
            }
            else {
              fVar13 = SQRT(fVar13);
            }
            subd[uVar7] = fVar14 * fVar13;
            fVar13 = 1.0 / fVar13;
            fVar18 = fVar18 * fVar13;
          }
          uVar1 = uVar7 - 1;
          fVar15 = fVar15 * fVar16;
          fVar14 = diag[uVar7] - fVar17;
          fVar16 = (diag[uVar1] - fVar14) * fVar18 + (fVar15 + fVar15) * fVar13;
          fVar17 = fVar18 * fVar16;
          diag[uVar7] = fVar14 + fVar17;
          lVar4 = 0;
          do {
            fVar14 = *(float *)((long)pfVar9 + lVar4 + -4);
            fVar2 = *(float *)((long)pfVar9 + lVar4);
            *(float *)((long)pfVar9 + lVar4) = fVar18 * fVar14 + fVar13 * fVar2;
            *(float *)((long)pfVar9 + lVar4 + -4) = fVar14 * fVar13 + fVar2 * -fVar18;
            lVar4 = lVar4 + 0xc;
          } while (lVar4 != 0x24);
          fVar14 = fVar16 * fVar13 + -fVar15;
          pfVar9 = pfVar9 + -1;
          uVar7 = uVar1;
          fVar15 = fVar13;
        } while ((long)uVar11 < (long)uVar1);
      }
      diag[uVar11] = diag[uVar11] - fVar17;
      subd[uVar11] = fVar14;
      subd[uVar5] = 0.0;
      if (uVar11 == uVar5) goto LAB_001b3d4b;
      local_b0 = local_b0 + 1;
    } while (local_b0 != 0x20);
    local_b0 = 0x20;
LAB_001b3d4b:
    if (local_b0 == 0x20) {
      return bVar12;
    }
    bVar12 = 1 < uVar11;
    uVar11 = uVar11 + 1;
    lVar8 = lVar8 + -1;
    pfVar6 = pfVar6 + 1;
    pfVar10 = pfVar10 + 1;
    if (uVar11 == 3) {
      return bVar12;
    }
  } while( true );
}

Assistant:

static bool EigenSolver3_QLAlgorithm(float mat[3][3], float *diag, float *subd)
	{
		// QL iteration with implicit shifting to reduce matrix from tridiagonal
		// to diagonal
		const int maxiter = 32;
		for (int ell = 0; ell < 3; ell++) {
			int iter;
			for (iter = 0; iter < maxiter; iter++) {
				int m;
				for (m = ell; m <= 1; m++) {
					float dd = fabsf(diag[m]) + fabsf(diag[m + 1]);
					if ( fabsf(subd[m]) + dd == dd )
						break;
				}
				if ( m == ell )
					break;
				float g = (diag[ell + 1] - diag[ell]) / (2 * subd[ell]);
				float r = sqrtf(g * g + 1);
				if ( g < 0 )
					g = diag[m] - diag[ell] + subd[ell] / (g - r);
				else
					g = diag[m] - diag[ell] + subd[ell] / (g + r);
				float s = 1, c = 1, p = 0;
				for (int i = m - 1; i >= ell; i--) {
					float f = s * subd[i], b = c * subd[i];
					if ( fabsf(f) >= fabsf(g) ) {
						c = g / f;
						r = sqrtf(c * c + 1);
						subd[i + 1] = f * r;
						c *= (s = 1 / r);
					} else {
						s = f / g;
						r = sqrtf(s * s + 1);
						subd[i + 1] = g * r;
						s *= (c = 1 / r);
					}
					g = diag[i + 1] - p;
					r = (diag[i] - g) * s + 2 * b * c;
					p = s * r;
					diag[i + 1] = g + p;
					g = c * r - b;
					for (int k = 0; k < 3; k++) {
						f = mat[k][i + 1];
						mat[k][i + 1] = s * mat[k][i] + c * f;
						mat[k][i] = c * mat[k][i] - s * f;
					}
				}
				diag[ell] -= p;
				subd[ell] = g;
				subd[m] = 0;
			}
			if ( iter == maxiter )
				// should not get here under normal circumstances
				return false;
		}
		return true;
	}